

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanojson3.h
# Opt level: O0

json * __thiscall
nanojson3::json::json_reader<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::read_number
          (json *__return_storage_ptr__,
          json_reader<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *this)

{
  char *pcVar1;
  bool bVar2;
  int_type iVar3;
  bad_format *pbVar4;
  size_t sVar5;
  longdouble in_ST0;
  longdouble in_ST1;
  __integer_from_chars_result_type<int> _Var6;
  to_chars_result tVar7;
  __integer_from_chars_result_type<long_long> _Var8;
  undefined1 auVar9 [12];
  int local_310;
  int local_30c;
  longdouble local_298 [2];
  longdouble local_278 [2];
  char *local_258;
  char *ptr_3;
  undefined1 auStack_248 [8];
  js_floating ret_1;
  char *local_228;
  char *ptr_2;
  longlong local_218;
  js_integer ret;
  optional<int> local_208;
  string_view local_200;
  char *local_1f0;
  char *ptr_1;
  char *local_1e0;
  char *ptr;
  int local_1d0;
  int_type local_1cc;
  int exp_value;
  string_view local_1c0;
  iter local_1ac;
  char *local_1a8;
  char *exp_limit;
  char *exp;
  char exp_part [32];
  int_type local_16c;
  optional<int> local_168;
  string_view local_160;
  iter local_150 [2];
  optional<int> local_148;
  string_view local_140;
  int_type local_12c;
  optional<int> local_128;
  string_view local_120 [2];
  optional<int> local_f8;
  string_view local_f0;
  iter local_dc;
  byte local_d5;
  undefined4 local_d4;
  undefined4 uStack_d0;
  bool integer_type;
  int minimum_exp_offset;
  int maximum_exp_offset;
  int exp_offset;
  char *decimal_limit;
  char *fraction_limit;
  char *integer_limit;
  char *p;
  char buffer [128];
  anon_class_1_0_00000001 local_19;
  json_reader<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *pjStack_18;
  anon_class_1_0_00000001 is_digit;
  json_reader<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *this_local;
  
  local_19 = (anon_class_1_0_00000001)0x0;
  pjStack_18 = this;
  memset(&p,0,0x80);
  integer_limit = (char *)&p;
  fraction_limit = buffer + 0x34;
  decimal_limit = buffer + 0x38;
  _maximum_exp_offset = buffer + 0x78;
  minimum_exp_offset = 0;
  uStack_d0 = 0x7fffffff;
  local_d4 = 0x80000000;
  local_d5 = 1;
  bVar2 = input_stream::eat(&this->input_,0x2d);
  if (bVar2) {
    pcVar1 = integer_limit + 1;
    *integer_limit = '-';
    integer_limit = pcVar1;
  }
  bVar2 = has_option(this,allow_number_with_plus_sign);
  if (bVar2) {
    input_stream::eat(&this->input_,0x2b);
  }
  bVar2 = input_stream::eat(&this->input_,0x30);
  if (bVar2) {
    *integer_limit = '0';
    integer_limit = integer_limit + 1;
  }
  else {
    iVar3 = input_stream::operator*(&this->input_);
    bVar2 = read_number::anon_class_1_0_00000001::operator()(&local_19,iVar3);
    if (!bVar2) {
      pbVar4 = (bad_format *)__cxa_allocate_exception(0x10);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (local_120,"invalid number format: expected a digit");
      local_12c = input_stream::operator*(&this->input_);
      std::optional<int>::optional<int,_true>(&local_128,&local_12c);
      bad_format(pbVar4,this,local_120[0],local_128);
      __cxa_throw(pbVar4,&exceptions::bad_format::typeinfo,exceptions::bad_format::~bad_format);
    }
    while( true ) {
      iVar3 = input_stream::operator*(&this->input_);
      bVar2 = read_number::anon_class_1_0_00000001::operator()(&local_19,iVar3);
      if (!bVar2) break;
      if (integer_limit < fraction_limit) {
        local_dc = input_stream::operator++(&this->input_,0);
        iVar3 = iter::operator*(&local_dc);
        *integer_limit = (char)iVar3;
        integer_limit = integer_limit + 1;
      }
      else {
        if (0x7ffffffe < minimum_exp_offset) {
          pbVar4 = (bad_format *)__cxa_allocate_exception(0x10);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_f0,"invalid number format: too long integer sequence");
          std::optional<int>::optional(&local_f8);
          bad_format(pbVar4,this,local_f0,local_f8);
          __cxa_throw(pbVar4,&exceptions::bad_format::typeinfo,exceptions::bad_format::~bad_format);
        }
        minimum_exp_offset = minimum_exp_offset + 1;
        input_stream::operator++(&this->input_);
      }
    }
  }
  bVar2 = input_stream::eat(&this->input_,0x2e);
  if (bVar2) {
    if (decimal_limit <= integer_limit) {
      __assert_fail("p < fraction_limit",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/ttsuki[P]nanojson/nanojson3.h"
                    ,0x3fa,
                    "json nanojson3::json::json_reader<std::istreambuf_iterator<char>>::read_number() [CharInputIterator = std::istreambuf_iterator<char>]"
                   );
    }
    *integer_limit = '.';
    local_d5 = 0;
    integer_limit = integer_limit + 1;
    iVar3 = input_stream::operator*(&this->input_);
    bVar2 = read_number::anon_class_1_0_00000001::operator()(&local_19,iVar3);
    if (!bVar2) {
      pbVar4 = (bad_format *)__cxa_allocate_exception(0x10);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_160,"invalid number format: expected a digit");
      local_16c = input_stream::operator*(&this->input_);
      std::optional<int>::optional<int,_true>(&local_168,&local_16c);
      bad_format(pbVar4,this,local_160,local_168);
      __cxa_throw(pbVar4,&exceptions::bad_format::typeinfo,exceptions::bad_format::~bad_format);
    }
    if (((char)p == '0') || (((char)p == '-' && (p._1_1_ == '0')))) {
      while (iVar3 = input_stream::operator*(&this->input_), iVar3 == 0x30) {
        if (minimum_exp_offset < -0x7fffffff) {
          pbVar4 = (bad_format *)__cxa_allocate_exception(0x10);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_140,"invalid number format: too long integer sequence");
          std::optional<int>::optional(&local_148);
          bad_format(pbVar4,this,local_140,local_148);
          __cxa_throw(pbVar4,&exceptions::bad_format::typeinfo,exceptions::bad_format::~bad_format);
        }
        minimum_exp_offset = minimum_exp_offset + -1;
        input_stream::operator++(&this->input_);
      }
    }
    while( true ) {
      iVar3 = input_stream::operator*(&this->input_);
      bVar2 = read_number::anon_class_1_0_00000001::operator()(&local_19,iVar3);
      if (!bVar2) break;
      if (integer_limit < decimal_limit) {
        local_150[0] = input_stream::operator++(&this->input_,0);
        iVar3 = iter::operator*(local_150);
        *integer_limit = (char)iVar3;
        integer_limit = integer_limit + 1;
      }
      else {
        input_stream::operator++(&this->input_);
      }
    }
  }
  iVar3 = input_stream::operator*(&this->input_);
  if ((iVar3 == 0x65) || (iVar3 = input_stream::operator*(&this->input_), iVar3 == 0x45)) {
    input_stream::operator++(&this->input_);
    local_d5 = 0;
    memset(&exp,0,0x20);
    exp_limit = (char *)&exp;
    sVar5 = std::size<char,32ul>((char (*) [32])&exp);
    local_1a8 = exp_part + (sVar5 - 8);
    bVar2 = input_stream::eat(&this->input_,0x2d);
    if (bVar2) {
      pcVar1 = exp_limit + 1;
      *exp_limit = '-';
      exp_limit = pcVar1;
    }
    else {
      input_stream::eat(&this->input_,0x2b);
    }
    iVar3 = input_stream::operator*(&this->input_);
    bVar2 = read_number::anon_class_1_0_00000001::operator()(&local_19,iVar3);
    if (!bVar2) {
      pbVar4 = (bad_format *)__cxa_allocate_exception(0x10);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_1c0,"invalid number format: expected a digit");
      local_1cc = input_stream::operator*(&this->input_);
      std::optional<int>::optional<int,_true>((optional<int> *)&exp_value,&local_1cc);
      bad_format(pbVar4,this,local_1c0,(optional<int>)_exp_value);
      __cxa_throw(pbVar4,&exceptions::bad_format::typeinfo,exceptions::bad_format::~bad_format);
    }
    while( true ) {
      iVar3 = input_stream::operator*(&this->input_);
      bVar2 = read_number::anon_class_1_0_00000001::operator()(&local_19,iVar3);
      if (!bVar2) break;
      if (exp_limit < local_1a8) {
        local_1ac = input_stream::operator++(&this->input_,0);
        iVar3 = iter::operator*(&local_1ac);
        *exp_limit = (char)iVar3;
        exp_limit = exp_limit + 1;
      }
      else {
        input_stream::operator++(&this->input_);
      }
    }
    local_1d0 = 0;
    _Var6 = std::from_chars<int>((char *)&exp,exp_limit,&local_1d0,10);
    local_1e0 = _Var6.ptr;
    ptr._0_4_ = _Var6.ec;
    if (((errc)ptr == 0) && (local_1e0 == exp_limit)) {
      if ((minimum_exp_offset < 1) || (local_1d0 <= 0x7fffffff - minimum_exp_offset)) {
        if ((minimum_exp_offset < 0) && (local_1d0 < -0x80000000 - minimum_exp_offset)) {
          local_310 = -0x80000000;
        }
        else {
          local_310 = minimum_exp_offset + local_1d0;
        }
        local_30c = local_310;
      }
      else {
        local_30c = 0x7fffffff;
      }
      minimum_exp_offset = local_30c;
    }
    else {
      if (((errc)ptr != result_out_of_range) || (local_1e0 != exp_limit)) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/ttsuki[P]nanojson/nanojson3.h"
                      ,0x437,
                      "json nanojson3::json::json_reader<std::istreambuf_iterator<char>>::read_number() [CharInputIterator = std::istreambuf_iterator<char>]"
                     );
      }
      minimum_exp_offset = -0x80000000;
      if ((char)exp == '-') {
        minimum_exp_offset = 0x7fffffff;
      }
    }
  }
  if (minimum_exp_offset != 0) {
    local_d5 = 0;
    if (_maximum_exp_offset <= integer_limit) {
      __assert_fail("p < decimal_limit",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/ttsuki[P]nanojson/nanojson3.h"
                    ,0x43f,
                    "json nanojson3::json::json_reader<std::istreambuf_iterator<char>>::read_number() [CharInputIterator = std::istreambuf_iterator<char>]"
                   );
    }
    if (integer_limit < _maximum_exp_offset) {
      *integer_limit = 'e';
      integer_limit = integer_limit + 1;
    }
    tVar7 = std::to_chars(integer_limit,_maximum_exp_offset,minimum_exp_offset,10);
    local_1f0 = tVar7.ptr;
    ptr_1._0_4_ = tVar7.ec;
    if ((errc)ptr_1 != 0) {
      pbVar4 = (bad_format *)__cxa_allocate_exception(0x10);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_200,"invalid number format: unexpected error.");
      std::optional<int>::optional(&local_208);
      bad_format(pbVar4,this,local_200,local_208);
      __cxa_throw(pbVar4,&exceptions::bad_format::typeinfo,exceptions::bad_format::~bad_format);
    }
    ptr_1._0_4_ = 0;
    integer_limit = local_1f0;
  }
  if ((local_d5 & 1) != 0) {
    local_218 = 0;
    _Var8 = std::from_chars<long_long>((char *)&p,integer_limit,&local_218,10);
    local_228 = _Var8.ptr;
    ptr_2._0_4_ = _Var8.ec;
    if (((errc)ptr_2 == 0) && (local_228 == integer_limit)) {
      json<(nanojson3::json_type_index)3,long_long&>(__return_storage_ptr__,&local_218);
      return __return_storage_ptr__;
    }
  }
  _auStack_248 = (longdouble)0;
  auVar9 = std::from_chars((char *)&p,integer_limit,(longdouble *)auStack_248,general);
  ptr_3._0_4_ = auVar9._8_4_;
  local_258 = auVar9._0_8_;
  if ((int)ptr_3 != 0 && (int)ptr_3 != 0x22) {
    __assert_fail("ec == std::errc{} || ec == std::errc::result_out_of_range",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ttsuki[P]nanojson/nanojson3.h"
                  ,0x45b,
                  "json nanojson3::json::json_reader<std::istreambuf_iterator<char>>::read_number() [CharInputIterator = std::istreambuf_iterator<char>]"
                 );
  }
  if (local_258 == integer_limit) {
    if ((local_258 == integer_limit) && ((int)ptr_3 == 0)) {
      json<(nanojson3::json_type_index)4,long_double&>(__return_storage_ptr__,auStack_248);
    }
    else {
      if ((int)ptr_3 != 0x22) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/ttsuki[P]nanojson/nanojson3.h"
                      ,0x469,
                      "json nanojson3::json::json_reader<std::istreambuf_iterator<char>>::read_number() [CharInputIterator = std::istreambuf_iterator<char>]"
                     );
      }
      if (minimum_exp_offset < 0) {
        local_298[0] = (longdouble)0;
        json<(nanojson3::json_type_index)4,long_double>(__return_storage_ptr__,local_298);
      }
      else {
        std::numeric_limits<long_double>::infinity();
        std::numeric_limits<long_double>::infinity();
        local_278[0] = -in_ST1;
        if ((char)p != '-') {
          local_278[0] = in_ST0;
        }
        json<(nanojson3::json_type_index)4,long_double>(__return_storage_ptr__,local_278);
      }
    }
    return __return_storage_ptr__;
  }
  __assert_fail("ptr == p",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/ttsuki[P]nanojson/nanojson3.h"
                ,0x45c,
                "json nanojson3::json::json_reader<std::istreambuf_iterator<char>>::read_number() [CharInputIterator = std::istreambuf_iterator<char>]"
               );
}

Assistant:

json read_number()
        {
            constexpr auto is_digit = [](int_type i)-> bool { return i >= '0' && i <= '9'; }; // locale-independent is_digit

            char buffer[128]{};
            char* p = buffer;
            char* const integer_limit = buffer + 60;
            char* const fraction_limit = buffer + 64;
            char* const decimal_limit = buffer + 128;

            int exp_offset = 0;
            constexpr auto maximum_exp_offset = (std::numeric_limits<decltype(exp_offset)>::max)();
            constexpr auto minimum_exp_offset = (std::numeric_limits<decltype(exp_offset)>::lowest)();

            bool integer_type = true;

            // parse integer part
            {
                if (input_.eat('-')) { *p++ = '-'; }                                                  // minus sign
                if (has_option(json_parse_option::allow_number_with_plus_sign) && input_.eat('+')) {} // ignore plus sign

                if (input_.eat('0')) { *p++ = '0'; } // put '0', leading zeros are not allowed in JSON.
                else if (is_digit(*input_))          // not zero
                {
                    while (is_digit(*input_))
                        if (p < integer_limit) *p++ = static_cast<char_type>(*input_++);  // put digit
                        else if (exp_offset < maximum_exp_offset) ++exp_offset, ++input_; // drop digit
                        else throw bad_format("invalid number format: too long integer sequence");
                }
                else throw bad_format("invalid number format: expected a digit", *input_);
            }

            if (input_.eat('.')) // accept fraction point part
            {
                assert(p < fraction_limit);
                *p++ = '.'; // put decimal point
                integer_type = false;

                if (is_digit(*input_))
                {
                    // if integer part is zero (parse '-0.0000...ddd')
                    if ((buffer[0] == '0') || (buffer[0] == '-' && buffer[1] == '0'))
                    {
                        while (*input_ == '0')
                            if (exp_offset > minimum_exp_offset) --exp_offset, ++input_; // drop '0'
                            else throw bad_format("invalid number format: too long integer sequence");
                    }

                    while (is_digit(*input_))
                    {
                        if (p < fraction_limit) *p++ = static_cast<char_type>(*input_++); // put digit
                        else ++input_;                                                    // drop digit
                    }
                }
                else throw bad_format("invalid number format: expected a digit", *input_);
            }

            if (*input_ == 'e' || *input_ == 'E') // accept exponent part
            {
                ++input_; // 'e'
                integer_type = false;

                char exp_part[32]{};
                char* exp = exp_part;
                char* const exp_limit = exp_part + std::size(exp_part);

                // read

                if (input_.eat('-')) { *exp++ = '-'; }
                else if (input_.eat('+')) {} // drop '+'

                if (is_digit(*input_))
                {
                    while (is_digit(*input_))
                    {
                        if (exp < exp_limit) *exp++ = static_cast<char_type>(*input_++); // put digit
                        else ++input_;                                                   // drop digit (it must be overflow, handle later)
                    }
                }
                else throw bad_format("invalid number format: expected a digit", *input_);

                // parse exponent
                int exp_value{};
                auto [ptr, ec] = std::from_chars(exp_part, exp, exp_value, 10);

                if (ec == std::errc{} && ptr == exp)
                {
                    exp_offset = exp_offset > 0 && exp_value > maximum_exp_offset - exp_offset ? maximum_exp_offset : exp_offset < 0 && exp_value < minimum_exp_offset - exp_offset ? minimum_exp_offset : exp_offset + exp_value;
                }
                else if (ec == std::errc::result_out_of_range && ptr == exp)
                {
                    exp_offset = exp_part[0] == '-' ? maximum_exp_offset : minimum_exp_offset;
                }
                else // other error (bug)
                {
                    assert(false);
                    throw bad_format("invalid number format: unexpected parse error "); // unexpected
                }
            }

            if (exp_offset != 0) // append parsed exponent part to buffer
            {
                integer_type = false;
                assert(p < decimal_limit);
                if (p < decimal_limit) *p++ = 'e';
                auto [ptr, ec] = std::to_chars(p, decimal_limit, exp_offset, 10);
                if (ec != std::errc{}) throw bad_format("invalid number format: unexpected error.");
                p = ptr;
            }

            // try to parse as integer type
            if (integer_type)
            {
                json::js_integer ret{};
                auto [ptr, ec] = std::from_chars(buffer, p, ret, 10);
                if (ec == std::errc{} && ptr == p) return json{in_place_index::integer, ret}; // integer OK
            }

            // try to parse as floating type (should succeed)
            {
                json::js_floating ret{};
#if (defined(__cpp_lib_to_chars) && __cpp_lib_to_chars >= 201611L) // compiler has floating-point from_chars
                auto [ptr, ec] = std::from_chars(buffer, p, ret);
#else // use fallback implementation
                std::istringstream tmp{std::string(buffer, p)};
                tmp.imbue(std::locale::classic());
                tmp >> ret;
                std::errc ec = !tmp ? std::errc::result_out_of_range : std::errc{}; // if fails, assume it must be out of range.
                const char* ptr = !tmp ? p : tmp.eof() ? p : buffer + tmp.tellg();
#endif

                assert(ec == std::errc{} || ec == std::errc::result_out_of_range);
                assert(ptr == p);

                if (ptr == p && ec == std::errc{}) return json{in_place_index::floating, ret}; // floating OK

                if (ec == std::errc::result_out_of_range) // overflow or underflow
                {
                    if (exp_offset >= 0) // overflow
                        return json{in_place_index::floating, buffer[0] != '-' ? +std::numeric_limits<json::js_floating>::infinity() : -std::numeric_limits<json::js_floating>::infinity()};
                    else // underflow
                        return json{in_place_index::floating, buffer[0] != '-' ? +static_cast<json::js_floating>(+0.0) : -static_cast<json::js_floating>(-0.0)};
                }
            }

            assert(false);
            throw bad_format("invalid number format: failed to parse");
        }